

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilProgress.c
# Opt level: O3

ProgressBar * Extra_ProgressBarStart(FILE *pFile,int nItemsTotal)

{
  int iVar1;
  Abc_Frame_t *p;
  ProgressBar *p_00;
  
  p_00 = (ProgressBar *)0x0;
  p = Abc_FrameGetGlobalFrame();
  iVar1 = Abc_FrameShowProgress(p);
  if (iVar1 != 0) {
    p_00 = (ProgressBar *)calloc(1,0x18);
    p_00->pFile = pFile;
    p_00->nItemsTotal = nItemsTotal;
    p_00->posTotal = 0x4e;
    p_00->posCur = 1;
    p_00->nItemsNext = (int)(((double)nItemsTotal * 8.0) / 78.0);
    Extra_ProgressBarShow(p_00,(char *)0x0);
  }
  return p_00;
}

Assistant:

ProgressBar * Extra_ProgressBarStart( FILE * pFile, int nItemsTotal )
{
    ProgressBar * p;
    if ( !Abc_FrameShowProgress(Abc_FrameGetGlobalFrame()) ) return NULL;
    p = ABC_ALLOC( ProgressBar, 1 );
    memset( p, 0, sizeof(ProgressBar) );
    p->pFile       = pFile;
    p->nItemsTotal = nItemsTotal;
    p->posTotal    = 78;
    p->posCur      = 1;
    p->nItemsNext  = (int)((7.0+p->posCur)*p->nItemsTotal/p->posTotal);
    Extra_ProgressBarShow( p, NULL );
    return p;
}